

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  double __val;
  double __val_00;
  double __val_01;
  Variable x;
  Variable y;
  Variable local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Variable local_e8;
  BinaryExpression local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_120);
  Kandinsky::Variable::Variable(&local_e8);
  (local_120.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_e8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::pow<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            ((PowerExpression *)&local_d0,&local_120,&local_e8);
  dVar1 = Kandinsky::PowerExpression::evaluate((PowerExpression *)&local_d0);
  (**((local_120.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_48,__val);
  std::operator+(&local_a8,&local_48," ^ ");
  (**((local_e8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_68,__val_00);
  std::operator+(&local_108,&local_a8,&local_68);
  std::operator+(&local_28,&local_108," != 9");
  Kandinsky::assertOrExit((bool)(-(dVar1 == 9.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  Kandinsky::BinaryExpression::~BinaryExpression(&local_d0);
  local_a8._M_dataplus._M_p._0_4_ = 2;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>
            ((PowerExpression *)&local_d0,&local_120,(int *)&local_a8);
  dVar1 = Kandinsky::PowerExpression::evaluate((PowerExpression *)&local_d0);
  (**((local_120.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_108,__val_01);
  std::operator+(&local_88,&local_108," ^ 2 != 9");
  Kandinsky::assertOrExit((bool)(-(dVar1 == 9.0) & 1),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  Kandinsky::BinaryExpression::~BinaryExpression(&local_d0);
  Kandinsky::Variable::~Variable(&local_e8);
  Kandinsky::Variable::~Variable(&local_120);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit(pow(x, y).evaluate() == 9, std::to_string(x.evaluate()) + " ^ " + std::to_string(y.evaluate()) + " != 9");
    assertOrExit(pow(x, 2).evaluate() == 9, std::to_string(x.evaluate()) + " ^ 2 != 9");
    return 0;
}